

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O3

void __thiscall DeflateDecoder::run(DeflateDecoder *this)

{
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  pointer pcVar1;
  size_type *psVar2;
  Lz77Decoder lz77;
  HuffmanDecoder huffman;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  long *local_118;
  long local_110;
  long local_108 [2];
  Cryptor local_f8;
  long *local_a8 [2];
  long local_98 [2];
  HuffmanDecoder local_88;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deflate decryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  pcVar1 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_138 = &local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + (this->super_Cryptor).in_message_._M_string_length
            );
  psVar2 = &local_f8.in_message_._M_string_length;
  local_f8._vptr_Cryptor = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_138,local_138->_M_local_buf + local_130);
  local_88.super_Cryptor.in_message_._M_dataplus._M_p =
       (pointer)&local_88.super_Cryptor.in_message_.field_2;
  if (local_f8._vptr_Cryptor == (_func_int **)psVar2) {
    local_88.super_Cryptor.in_message_.field_2._8_8_ =
         local_f8.in_message_.field_2._M_allocated_capacity;
  }
  else {
    local_88.super_Cryptor.in_message_._M_dataplus._M_p = (pointer)local_f8._vptr_Cryptor;
  }
  local_88.super_Cryptor.out_message_._M_dataplus._M_p =
       (pointer)&local_88.super_Cryptor.out_message_.field_2;
  local_88.super_Cryptor.in_message_._M_string_length =
       (size_type)local_f8.in_message_._M_dataplus._M_p;
  local_88.super_Cryptor.out_message_._M_string_length = 0;
  local_88.super_Cryptor.out_message_.field_2._M_local_buf[0] = '\0';
  local_88.super_Cryptor.show_ = false;
  local_88.super_Cryptor._vptr_Cryptor = (_func_int **)&PTR__HuffmanDecoder_0010fba8;
  this_00 = &local_88.nodes_;
  local_88.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node._M_size = 0;
  local_88.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  local_88.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128._M_allocated_capacity + 1);
  }
  HuffmanDecoder::run(&local_88);
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_88.super_Cryptor.out_message_._M_dataplus._M_p,
             local_88.super_Cryptor.out_message_._M_dataplus._M_p +
             local_88.super_Cryptor.out_message_._M_string_length);
  local_138 = &local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118,local_110 + (long)local_118);
  local_f8.in_message_._M_dataplus._M_p = (pointer)&local_f8.in_message_.field_2;
  if (local_138 == &local_128) {
    local_f8.in_message_.field_2._8_8_ = local_128._8_8_;
  }
  else {
    local_f8.in_message_._M_dataplus._M_p = (pointer)local_138;
  }
  local_f8.out_message_._M_dataplus._M_p = (pointer)&local_f8.out_message_.field_2;
  local_f8.in_message_._M_string_length = local_130;
  local_f8.out_message_._M_string_length = 0;
  local_f8.out_message_.field_2._M_local_buf[0] = '\0';
  local_f8.show_ = false;
  local_f8._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010fd40;
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  Lz77Decoder::run((Lz77Decoder *)&local_f8);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,local_f8.out_message_._M_dataplus._M_p,
             local_f8.out_message_._M_dataplus._M_p + local_f8.out_message_._M_string_length);
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"decryption done",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  Cryptor::~Cryptor(&local_f8);
  std::__cxx11::
  _List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::_M_clear
            (&this_00->
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
            );
  Cryptor::~Cryptor(&local_88.super_Cryptor);
  return;
}

Assistant:

void DeflateDecoder::run() {
  cout << "Deflate decryption..." << endl;

  HuffmanDecoder huffman(get_in_message());
  huffman.run();
  Lz77Decoder lz77(huffman.get_out_message());
  lz77.run();
  set_out_message(lz77.get_out_message());

  cout << "decryption done" << endl;
}